

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O0

optional<double> anon_unknown.dwarf_7eee46::qConvertToRealNumber(Private *d)

{
  bool bVar1;
  int iVar2;
  QCborValue *this;
  Private *in_RDI;
  long in_FS_OFFSET;
  optional<double> oVar3;
  double r;
  bool ok;
  optional<long_long> l;
  Private *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  QString *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffffc0;
  undefined1 allowStringToBool;
  Private *in_stack_ffffffffffffffc8;
  _Storage<double,_true> local_18;
  undefined1 local_10;
  long local_8;
  
  allowStringToBool = (undefined1)((ulong)in_stack_ffffffffffffffc0 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ::QVariant::Private::typeInterface(in_RDI);
  iVar2 = QBasicAtomicInteger::operator_cast_to_int((QBasicAtomicInteger<int> *)0x439b08);
  this = (QCborValue *)(ulong)(iVar2 - 3);
  switch(this) {
  case (QCborValue *)0x0:
  case (QCborValue *)0x2:
  case (QCborValue *)0x20:
  case (QCborValue *)0x21:
  case (QCborValue *)0x22:
  case (QCborValue *)0x35:
  case (QCborValue *)0x36:
    qMetaTypeUNumber(in_stack_ffffffffffffff68);
    std::optional<double>::optional<double,_true>
              ((optional<double> *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
               (double *)in_stack_ffffffffffffff68);
    break;
  default:
    qConvertToNumber(in_stack_ffffffffffffffc8,(bool)allowStringToBool);
    bVar1 = std::optional::operator_cast_to_bool((optional<long_long> *)0x439ce5);
    if (bVar1) {
      std::optional<long_long>::operator*((optional<long_long> *)0x439cf5);
      std::optional<double>::optional<double,_true>
                ((optional<double> *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                 (double *)in_stack_ffffffffffffff68);
    }
    else {
      std::optional<double>::optional((optional<double> *)&local_18);
    }
    break;
  case (QCborValue *)0x3:
    ::QVariant::Private::get<double>((Private *)0x439b88);
    std::optional<double>::optional<const_double_&,_true>
              ((optional<double> *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
               (double *)in_stack_ffffffffffffff68);
    break;
  case (QCborValue *)0x7:
    ::QVariant::Private::get<QString>((Private *)0x439b3b);
    QString::toDouble(in_stack_ffffffffffffff78,
                      (bool *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
    std::optional<double>::optional((optional<double> *)&local_18);
    break;
  case (QCborValue *)0x23:
    ::QVariant::Private::get<float>((Private *)0x439ba7);
    std::optional<double>::optional<double,_true>
              ((optional<double> *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
               (double *)in_stack_ffffffffffffff68);
    break;
  case (QCborValue *)0x2a:
    ::QVariant::Private::get<QJsonValue>((Private *)0x439c89);
    QJsonValue::toDouble
              ((QJsonValue *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
               (double)in_stack_ffffffffffffff68);
    std::optional<double>::optional<double,_true>
              ((optional<double> *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
               (double *)in_stack_ffffffffffffff68);
    break;
  case (QCborValue *)0x32:
    ::QVariant::Private::get<QCborValue>((Private *)0x439c57);
    ::QCborValue::toDouble(this,(double)in_stack_ffffffffffffff78);
    std::optional<double>::optional<double,_true>
              ((optional<double> *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
               (double *)in_stack_ffffffffffffff68);
    break;
  case (QCborValue *)0x3c:
    ::QVariant::Private::get<qfloat16>((Private *)0x439bd6);
    qfloat16::operator_cast_to_float
              ((qfloat16 *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
    std::optional<double>::optional<double,_true>
              ((optional<double> *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
               (double *)in_stack_ffffffffffffff68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  oVar3.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _9_7_ = (undefined7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8);
  oVar3.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _M_engaged = (bool)local_10;
  oVar3.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _M_payload = local_18;
  return (optional<double>)
         oVar3.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double>;
}

Assistant:

static std::optional<double> qConvertToRealNumber(const QVariant::Private *d)
{
    bool ok;
    switch (d->typeInterface()->typeId) {
    case QMetaType::QString:
        if (double r = d->get<QString>().toDouble(&ok); ok)
            return r;
        return std::nullopt;
    case QMetaType::Double:
        return d->get<double>();
    case QMetaType::Float:
        return double(d->get<float>());
    case QMetaType::Float16:
        return double(d->get<qfloat16>());
    case QMetaType::ULongLong:
    case QMetaType::UInt:
    case QMetaType::UChar:
    case QMetaType::Char16:
    case QMetaType::Char32:
    case QMetaType::UShort:
    case QMetaType::ULong:
        return double(qMetaTypeUNumber(d));
    case QMetaType::QCborValue:
        return d->get<QCborValue>().toDouble();
    case QMetaType::QJsonValue:
        return d->get<QJsonValue>().toDouble();
    default:
        // includes enum conversion as well as invalid types
        if (std::optional<qlonglong> l = qConvertToNumber(d))
            return double(*l);
        return std::nullopt;
    }
}